

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_create_workers(AV1_PRIMARY *ppi,int num_workers)

{
  int iVar1;
  AVxWorkerInterface *pAVar2;
  void *pvVar3;
  AVxWorker *pAVar4;
  long lVar5;
  int in_ESI;
  long in_RDI;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  AVxWorkerInterface *winterface;
  PrimaryMultiThreadInfo *p_mt_info;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar6;
  
  pAVar2 = aom_get_worker_interface();
  pvVar3 = aom_malloc(0x259c95);
  *(void **)(in_RDI + 0x12408) = pvVar3;
  if (*(long *)(in_RDI + 0x12408) == 0) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate p_mt_info->workers");
  }
  pvVar3 = aom_calloc(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0);
  *(void **)(in_RDI + 0x12410) = pvVar3;
  if (*(long *)(in_RDI + 0x12410) == 0) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate p_mt_info->tile_thr_data");
  }
  for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
    pAVar4 = (AVxWorker *)(*(long *)(in_RDI + 0x12408) + (long)iVar6 * 0x38);
    lVar5 = *(long *)(in_RDI + 0x12410) + (long)iVar6 * 0x1d0;
    (*pAVar2->init)(pAVar4);
    pAVar4->thread_name = "aom enc worker";
    *(int *)(lVar5 + 0x1cc) = iVar6;
    *(int *)(lVar5 + 0x1c8) = iVar6;
    if ((0 < iVar6) && (iVar1 = (*pAVar2->reset)(pAVar4), iVar1 == 0)) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_ERROR,
                         "Tile encoder thread creation failed");
    }
    (*pAVar2->sync)(pAVar4);
    *(int *)(in_RDI + 0x123d0) = *(int *)(in_RDI + 0x123d0) + 1;
  }
  return;
}

Assistant:

void av1_create_workers(AV1_PRIMARY *ppi, int num_workers) {
  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  assert(p_mt_info->num_workers == 0);

  AOM_CHECK_MEM_ERROR(&ppi->error, p_mt_info->workers,
                      aom_malloc(num_workers * sizeof(*p_mt_info->workers)));

  AOM_CHECK_MEM_ERROR(
      &ppi->error, p_mt_info->tile_thr_data,
      aom_calloc(num_workers, sizeof(*p_mt_info->tile_thr_data)));

  for (int i = 0; i < num_workers; ++i) {
    AVxWorker *const worker = &p_mt_info->workers[i];
    EncWorkerData *const thread_data = &p_mt_info->tile_thr_data[i];

    winterface->init(worker);
    worker->thread_name = "aom enc worker";

    thread_data->thread_id = i;
    // Set the starting tile for each thread.
    thread_data->start = i;

    if (i > 0) {
      // Create threads
      if (!winterface->reset(worker))
        aom_internal_error(&ppi->error, AOM_CODEC_ERROR,
                           "Tile encoder thread creation failed");
    }
    winterface->sync(worker);

    ++p_mt_info->num_workers;
  }
}